

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkSopToCubes(Abc_Ntk_t *pNtk,int fXor)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar2 = pNtk->vObjs;
    if (0 < pVVar2->nSize) {
      lVar3 = 0;
      do {
        if (pVVar2->pArray[lVar3] != (void *)0x0) {
          *(undefined8 *)((long)pVVar2->pArray[lVar3] + 0x40) = 0;
          pVVar2 = pNtk->vObjs;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar2->nSize);
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    pVVar2 = Abc_NtkDfs(pNtk,0);
    if (0 < pVVar2->nSize) {
      lVar3 = 0;
      do {
        Abc_NodeSopToCubes((Abc_Obj_t *)pVVar2->pArray[lVar3],pNtkNew,fXor);
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
    Abc_NtkFinalize(pNtk,pNtkNew);
    iVar1 = Abc_NtkCheck(pNtkNew);
    if (iVar1 == 0) {
      puts("Abc_NtkSopToCubes: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xa21,"Abc_Ntk_t *Abc_NtkSopToCubes(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSopToCubes( Abc_Ntk_t * pNtk, int fXor )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int i;
    assert( Abc_NtkIsSopLogic(pNtk) );
    Abc_NtkCleanCopy( pNtk );
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // perform conversion in the topological order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeSopToCubes( pNode, pNtkNew, fXor );
    Vec_PtrFree( vNodes );
    // make sure everything is okay
    Abc_NtkFinalize( pNtk, pNtkNew );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkSopToCubes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}